

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O1

void __thiscall VgaDebugGenerator::Generate_Mem(VgaDebugGenerator *this)

{
  string *__rhs;
  long lVar1;
  char cVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer pbVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ofstream fout;
  undefined1 auStack_268 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  pointer local_240;
  ulong local_238;
  long local_230;
  filebuf local_228 [8];
  undefined8 uStack_220;
  uint auStack_218 [2];
  byte abStack_210 [192];
  char acStack_150 [24];
  ios_base local_138 [264];
  
  __rhs = &(this->config).mem_file;
  std::operator+(&local_260,&(this->config).output_dir,__rhs);
  std::ofstream::ofstream((ostream *)&local_230,(string *)&local_260,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         __cxa_allocate_exception(0x20);
    std::operator+(&local_260,"Failed to open memory file \'",__rhs);
    std::operator+(__return_storage_ptr__,&local_260,"\'");
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  pbVar4 = (this->templte).lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_240 = (this->templte).lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = 0;
  if (pbVar4 != local_240) {
    do {
      if (0 < (this->config).template_width) {
        uVar7 = 0;
        local_238 = uVar6;
        do {
          if (uVar7 < pbVar4->_M_string_length) {
            *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
                 *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffffb5 | 8;
            *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 2;
            lVar1 = *(long *)(local_230 + -0x18);
            if (acStack_150[lVar1 + 1] == '\0') {
              cVar2 = std::ios::widen((char)auStack_268 + (char)lVar1 + '8');
              acStack_150[lVar1] = cVar2;
              acStack_150[lVar1 + 1] = '\x01';
            }
            acStack_150[lVar1] = '0';
            poVar3 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)&local_230,(int)(pbVar4->_M_dataplus)._M_p[uVar7]);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"00",2);
            std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)(ostream *)&local_230);
            poVar3 = (ostream *)&local_230;
          }
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)(this->config).template_width);
        uVar6 = (ulong)(uint)((int)local_238 + (int)uVar7);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_240);
  }
  if ((int)uVar6 < this->vga_size_pow2) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"00",2);
      cVar2 = (char)(ostream *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
    } while ((int)uVar5 < this->vga_size_pow2);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void VgaDebugGenerator::Generate_Mem() {
    std::ofstream fout(config.output_dir + config.mem_file);
    if (!fout) {
        throw "Failed to open memory file '" + config.mem_file + "'";
    }

    int curr = 0;
    for (const auto &line : templte.lines) {
        for (int i = 0; i < config.template_width; i++) {
            if (i < line.size()) {
                fout << std::hex << std::setw(2) << std::setfill('0') << static_cast<int>(line[i]) << std::endl;
            } else {
                fout << "00" << std::endl;
            }
            ++curr;
        }
    }
    while (curr < vga_size_pow2) {
        fout << "00" << std::endl;
        ++curr;
    }
}